

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

int tractor_beam_x1_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  ushort uVar7;
  Am_Object tb_source_bitmap;
  Am_Object tb_source;
  Am_Object AStack_38;
  Am_Object local_30;
  
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)TB_SOURCE);
  Am_Object::Am_Object(&local_30,pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_30,(ulong)SHIP_BITMAP);
  Am_Object::Am_Object(&AStack_38,pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_30,100);
  iVar1 = Am_Value::operator_cast_to_int(pAVar6);
  uVar7 = (ushort)&AStack_38;
  pAVar6 = (Am_Value *)Am_Object::Get(uVar7,100);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get(uVar7,0x66);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x65);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get(uVar7,0x67);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  Am_Object::Set((ushort)self,0x8c,(ulong)(uint)(iVar5 / 2 + iVar4));
  Am_Object::~Am_Object(&AStack_38);
  Am_Object::~Am_Object(&local_30);
  return iVar3 / 2 + iVar2 + iVar1;
}

Assistant:

Am_Define_Formula(int, tractor_beam_x1)
{
  Am_Object tb_source = (Am_Object)(self.Get(TB_SOURCE));
  Am_Object tb_source_bitmap = (Am_Object)(tb_source.Get(SHIP_BITMAP));
  int tb_source_x =
      ((int)(tb_source.Get(Am_LEFT)) + (int)(tb_source_bitmap.Get(Am_LEFT)) +
       ((int)(tb_source_bitmap.Get(Am_WIDTH)) / 2));
  int tb_source_y = ((int)(tb_source.Get(Am_TOP)) +
                     ((int)(tb_source_bitmap.Get(Am_HEIGHT)) / 2));
  self.Set(Am_Y1, tb_source_y);
  return (tb_source_x);
}